

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O0

void __thiscall QUndoModel::setStack(QUndoModel *this,QUndoStack *stack)

{
  QUndoStack *in_RSI;
  QUndoModel *in_RDI;
  long in_FS_OFFSET;
  QUndoModel *this_00;
  Connection local_20;
  Connection local_18;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_stack != in_RSI) {
    this_00 = in_RDI;
    if (in_RDI->m_stack != (QUndoStack *)0x0) {
      QObject::disconnect((QObject *)in_RDI->m_stack,"2cleanChanged(bool)",(QObject *)in_RDI,
                          "1stackChanged()");
      QObject::disconnect((QObject *)in_RDI->m_stack,"2indexChanged(int)",(QObject *)in_RDI,
                          "1stackChanged()");
      QObject::disconnect((QObject *)in_RDI->m_stack,"2destroyed(QObject*)",(QObject *)in_RDI,
                          "1stackDestroyed(QObject*)");
    }
    in_RDI->m_stack = in_RSI;
    if (in_RDI->m_stack != (QUndoStack *)0x0) {
      QObject::connect((QObject *)&local_10,(char *)in_RDI->m_stack,(QObject *)"2cleanChanged(bool)"
                       ,(char *)in_RDI,0xb4d1e9);
      QMetaObject::Connection::~Connection(&local_10);
      QObject::connect((QObject *)&local_18,(char *)in_RDI->m_stack,(QObject *)"2indexChanged(int)",
                       (char *)in_RDI,0xb4d1e9);
      QMetaObject::Connection::~Connection(&local_18);
      QObject::connect((QObject *)&local_20,(char *)in_RDI->m_stack,
                       (QObject *)"2destroyed(QObject*)",(char *)in_RDI,0xb4d20c);
      QMetaObject::Connection::~Connection(&local_20);
    }
    stackChanged(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoModel::setStack(QUndoStack *stack)
{
    if (m_stack == stack)
        return;

    if (m_stack != nullptr) {
        disconnect(m_stack, SIGNAL(cleanChanged(bool)), this, SLOT(stackChanged()));
        disconnect(m_stack, SIGNAL(indexChanged(int)), this, SLOT(stackChanged()));
        disconnect(m_stack, SIGNAL(destroyed(QObject*)), this, SLOT(stackDestroyed(QObject*)));
    }
    m_stack = stack;
    if (m_stack != nullptr) {
        connect(m_stack, SIGNAL(cleanChanged(bool)), this, SLOT(stackChanged()));
        connect(m_stack, SIGNAL(indexChanged(int)), this, SLOT(stackChanged()));
        connect(m_stack, SIGNAL(destroyed(QObject*)), this, SLOT(stackDestroyed(QObject*)));
    }

    stackChanged();
}